

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkStartFrom(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func)

{
  Abc_Ntk_t *pNtk_00;
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Vec_Vec_t *pVVar4;
  Abc_Cex_t *pAVar5;
  Vec_Int_t *pVVar6;
  void *pvVar7;
  Mio_Library_t *pLib;
  uint fCopyName;
  int iVar8;
  float fVar9;
  float fVar10;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_00 = Abc_NtkAlloc(Type,Func,1);
    iVar8 = pNtk->nBarBufs;
    pNtk_00->nConstrs = pNtk->nConstrs;
    pNtk_00->nBarBufs = iVar8;
    pcVar1 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar1;
    pcVar1 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_00->pSpec = pcVar1;
    Abc_NtkCleanCopy(pNtk);
    if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
      pAVar2 = Abc_AigConst1(pNtk_00);
      pAVar3 = Abc_AigConst1(pNtk);
      (pAVar3->field_6).pCopy = pAVar2;
    }
    for (iVar8 = 0; fCopyName = (uint)(Type != ABC_NTK_NETLIST), iVar8 < pNtk->vPis->nSize;
        iVar8 = iVar8 + 1) {
      pAVar2 = Abc_NtkPi(pNtk,iVar8);
      Abc_NtkDupObj(pNtk_00,pAVar2,fCopyName);
    }
    for (iVar8 = 0; iVar8 < pNtk->vPos->nSize; iVar8 = iVar8 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,iVar8);
      Abc_NtkDupObj(pNtk_00,pAVar2,fCopyName);
    }
    for (iVar8 = 0; iVar8 < pNtk->vBoxes->nSize; iVar8 = iVar8 + 1) {
      pAVar2 = Abc_NtkBox(pNtk,iVar8);
      Abc_NtkDupBox(pNtk_00,pAVar2,fCopyName);
    }
    for (iVar8 = 0; iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,iVar8);
      *(uint *)((long)(pAVar2->field_6).pTemp + 0x14) =
           *(uint *)((long)(pAVar2->field_6).pTemp + 0x14) & 0xfff |
           *(uint *)&pAVar2->field_0x14 & 0xfffff000;
    }
    Abc_ManTimeDup(pNtk,pNtk_00);
    if ((Vec_Vec_t *)pNtk->vOnehots != (Vec_Vec_t *)0x0) {
      pVVar4 = Vec_VecDupInt((Vec_Vec_t *)pNtk->vOnehots);
      pNtk_00->vOnehots = (Vec_Ptr_t *)pVVar4;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      pAVar5 = Abc_CexDup(pNtk->pSeqModel,pNtk->nObjCounts[8]);
      pNtk_00->pSeqModel = pAVar5;
    }
    if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
      pVVar6 = Vec_IntDup(pNtk->vObjPerm);
      pNtk_00->vObjPerm = pVVar6;
    }
    pNtk_00->AndGateDelay = pNtk->AndGateDelay;
    if (pNtk_00->pManTime != (Abc_ManTime_t *)0x0) {
      pvVar7 = Abc_FrameReadLibGen();
      if (((pvVar7 != (void *)0x0) && (pNtk_00->AndGateDelay == 0.0)) &&
         (!NAN(pNtk_00->AndGateDelay))) {
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        fVar9 = Mio_LibraryReadDelayAigNode(pLib);
        pNtk_00->AndGateDelay = fVar9;
      }
    }
    if (((pNtk->AndGateDelay != 0.0) || (NAN(pNtk->AndGateDelay))) &&
       ((pNtk->pManTime != (Abc_ManTime_t *)0x0 &&
        ((Type == ABC_NTK_STRASH && (pNtk->ntkType != ABC_NTK_STRASH)))))) {
      for (iVar8 = 0; iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
        pAVar2 = Abc_NtkCi(pNtk,iVar8);
        fVar10 = Abc_NodeReadArrivalWorst(pAVar2);
        fVar9 = 0.0;
        if (0.0 <= fVar10) {
          fVar9 = fVar10;
        }
        *(uint *)((long)(pAVar2->field_6).pTemp + 0x14) =
             *(uint *)((long)(pAVar2->field_6).pTemp + 0x14) & 0xfff |
             (int)(fVar9 / pNtk->AndGateDelay) << 0xc;
      }
    }
    if (pNtk->vCis->nSize != pNtk_00->vCis->nSize) {
      __assert_fail("Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa1,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
    if (pNtk->vCos->nSize != pNtk_00->vCos->nSize) {
      __assert_fail("Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa2,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
    if (pNtk->nObjCounts[8] != pNtk_00->nObjCounts[8]) {
      __assert_fail("Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa3,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFrom( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj;
    int fCopyNames, i;
    if ( pNtk == NULL )
        return NULL;
    // decide whether to copy the names
    fCopyNames = ( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, fCopyNames );
    // transfer logic level
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy->Level = pObj->Level;
    // transfer the names
//    Abc_NtkTrasferNames( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    if ( pNtk->vOnehots )
        pNtkNew->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    if ( pNtk->pSeqModel )
        pNtkNew->pSeqModel = Abc_CexDup( pNtk->pSeqModel, Abc_NtkLatchNum(pNtk) );
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    if ( pNtkNew->pManTime && Abc_FrameReadLibGen() && pNtkNew->AndGateDelay == 0.0 )
        pNtkNew->AndGateDelay = Mio_LibraryReadDelayAigNode((Mio_Library_t *)Abc_FrameReadLibGen());
    // initialize logic level of the CIs
    if ( pNtk->AndGateDelay != 0.0 && pNtk->pManTime != NULL && pNtk->ntkType != ABC_NTK_STRASH && Type == ABC_NTK_STRASH )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pCopy->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pObj)) / pNtk->AndGateDelay);
    }
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkCiNum(pNtk)    == Abc_NtkCiNum(pNtkNew) );
    assert( Abc_NtkCoNum(pNtk)    == Abc_NtkCoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}